

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearfit.cpp
# Opt level: O1

bool __thiscall
Logarithm::setSample(Logarithm *this,double *x,double *y,int count,bool enableWeight,double *w)

{
  bool bVar1;
  double *x_00;
  ulong uVar2;
  double dVar3;
  
  Polynomial::copy(&this->super_Polynomial,(EVP_PKEY_CTX *)x,(EVP_PKEY_CTX *)y);
  uVar2 = 0xffffffffffffffff;
  if (-1 < count) {
    uVar2 = (long)count * 8;
  }
  x_00 = (double *)operator_new__(uVar2);
  if (0 < count) {
    uVar2 = 0;
    do {
      if (x[uVar2] <= 0.0) {
        bVar1 = false;
        goto LAB_00103dfc;
      }
      dVar3 = log(x[uVar2]);
      x_00[uVar2] = dVar3;
      uVar2 = uVar2 + 1;
    } while ((uint)count != uVar2);
  }
  bVar1 = PolynomialFit::setSample((PolynomialFit *)this,x_00,y,count,enableWeight,w);
LAB_00103dfc:
  operator_delete__(x_00);
  return bVar1;
}

Assistant:

bool Logarithm::setSample(double *x, double *y, int count, bool enableWeight, double *w)
{
    //��ȡһ������
    copy(x,y,count);

    //����
    double *px = new double[count];
    for(int i(0) ; i<count ; i++){
        if(x[i] <= 0.0){
            delete [] px;
            return false;
        }

        px[i] = log(x[i]);
    }

    bool ret = PolynomialFit::setSample(px,y,count,enableWeight,w);
    delete [] px;
    return ret;
}